

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

int __thiscall BoardView::EPCCheck(BoardView *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *plVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  shared_ptr<Point> *p_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar12;
  shared_ptr<Point> *p_2;
  ulong uVar13;
  iterator __begin1;
  long lVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int epc [2];
  SharedVector<Point> *__range2;
  long local_50;
  uint local_48 [2];
  long *local_40;
  BoardView *local_38;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_38 = this;
  iVar11 = (*this->m_board->_vptr_Board[5])();
  local_40 = (long *)CONCAT44(extraout_var,iVar11);
  plVar12 = (long *)*local_40;
  if (plVar12 == (long *)local_40[1]) {
    iVar11 = 1;
  }
  else {
    fVar18 = 1.1754944e-38;
    do {
      fVar19 = *(float *)(*plVar12 + 4);
      if (*(float *)(*plVar12 + 4) <= fVar18) {
        fVar19 = fVar18;
      }
      plVar12 = plVar12 + 2;
      fVar18 = fVar19;
    } while (plVar12 != (long *)local_40[1]);
    local_50 = 0;
    do {
      iVar11 = (*local_38->m_board->_vptr_Board[4])();
      plVar12 = *(long **)CONCAT44(extraout_var_00,iVar11);
      plVar4 = (long *)((long *)CONCAT44(extraout_var_00,iVar11))[1];
      if (plVar12 != plVar4) {
        lVar5 = *local_40;
        lVar14 = local_40[1] - lVar5 >> 4;
        do {
          if (lVar14 == 1) {
LAB_00112ea3:
            local_48[local_50] = local_48[local_50] + 1;
          }
          else {
            fVar18 = 0.0;
            bVar17 = true;
            bVar15 = 0;
            bVar16 = 0;
            uVar13 = 0;
            fVar20 = 0.0;
            do {
              pfVar6 = *(float **)(lVar5 + uVar13 * 0x10);
              pfVar7 = *(float **)(lVar5 + (uVar13 + 1) * 0x10);
              fVar21 = *pfVar6;
              fVar1 = *pfVar7;
              if ((((fVar21 != fVar1) || (NAN(fVar21) || NAN(fVar1))) || (pfVar6[1] != pfVar7[1]))
                 || (NAN(pfVar6[1]) || NAN(pfVar7[1]))) {
                bVar9 = false;
                bVar10 = !bVar17;
                bVar17 = false;
                if (bVar10) {
                  bVar17 = bVar9;
                  if (((fVar18 == fVar1) && (!NAN(fVar18) && !NAN(fVar1))) && (uVar13 < lVar14 - 2U)
                     ) {
                    if ((fVar20 == pfVar7[1]) && (!NAN(fVar20) && !NAN(pfVar7[1]))) {
                      pfVar8 = *(float **)(lVar5 + 0x20 + uVar13 * 0x10);
                      fVar18 = *pfVar8;
                      fVar20 = pfVar8[1];
                      bVar17 = true;
                      uVar13 = uVar13 + 1;
                    }
                  }
                }
                fVar2 = pfVar6[1];
                fVar3 = pfVar7[1];
                if ((((fVar3 < fVar2) && (*(float *)(*plVar12 + 0x54) < fVar2)) &&
                    (fVar3 < *(float *)(*plVar12 + 0x54))) ||
                   (((fVar2 < fVar3 && (fVar2 < *(float *)(*plVar12 + 0x54))) &&
                    (*(float *)(*plVar12 + 0x54) < fVar3)))) {
                  if ((fVar21 != fVar1) || (NAN(fVar21) || NAN(fVar1))) {
                    fVar21 = fVar21 + (*(float *)(*plVar12 + 0x54) - fVar2) *
                                      ((fVar1 - fVar21) / (fVar3 - fVar2));
                  }
                  fVar1 = *(float *)(*plVar12 + 0x50);
                  if (fVar21 <= fVar1) {
                    if (fVar21 < fVar1) {
                      bVar15 = bVar15 ^ 1;
                    }
                  }
                  else {
                    bVar16 = bVar16 ^ 1;
                  }
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < lVar14 - 1U);
            if (!(bool)(bVar15 | bVar16)) goto LAB_00112ea3;
          }
          plVar12 = plVar12 + 2;
        } while (plVar12 != plVar4);
      }
      if (local_38->debug != false) {
        fprintf(_stderr,"EPC[%d]: %d\n",local_50,(ulong)local_48[local_50]);
      }
      plVar4 = (long *)local_40[1];
      for (plVar12 = (long *)*local_40; plVar12 != plVar4; plVar12 = plVar12 + 2) {
        *(float *)(*plVar12 + 4) = fVar19 - *(float *)(*plVar12 + 4);
      }
      bVar17 = local_50 == 0;
      local_50 = local_50 + 1;
    } while (bVar17);
    iVar11 = 0;
    if ((int)local_48[1] < (int)local_48[0] && (local_48[0] != 0 || local_48[1] != 0)) {
      plVar12 = (long *)local_40[1];
      for (local_40 = (long *)*local_40; local_40 != plVar12; local_40 = local_40 + 2) {
        *(float *)(*local_40 + 4) = fVar19 - *(float *)(*local_40 + 4);
      }
    }
  }
  return iVar11;
}

Assistant:

int BoardView::EPCCheck(void) {
	int epc[2] = {0, 0};
	int side;
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	if (outline.empty()) {
		return 1;
	};

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (side = 0; side < 2; side++) {
		for (auto &p : m_board->Pins()) {
			// auto p = pin.get();
			int l, r;
			int jump = 1;
			Point fp;

			l = 0;
			r = 0;

			for (size_t i = 0; i < outline.size() - 1; i++) {
				Point &pa = *outline[i];
				Point &pb = *outline[i + 1];

				// jump double/dud points
				if (pa.x == pb.x && pa.y == pb.y) continue;

				// if we encounter our hull/poly start point, then we've now created the
				// closed
				// hull, jump the next segment and reset the first-point
				if ((!jump) && (fp.x == pb.x) && (fp.y == pb.y)) {
					if (i < outline.size() - 2) {
						fp   = *outline[i + 2];
						jump = 1;
						i++;
					}
				} else {
					jump = 0;
				}

				// test to see if this segment makes the scan-cut.
				if ((pa.y > pb.y && p->position.y < pa.y && p->position.y > pb.y) ||
				    (pa.y < pb.y && p->position.y > pa.y && p->position.y < pb.y)) {
					ImVec2 intersect;

					intersect.y = p->position.y;
					if (pa.x == pb.x)
						intersect.x = pa.x;
					else
						intersect.x = (pb.x - pa.x) / (pb.y - pa.y) * (p->position.y - pa.y) + pa.x;

					if (intersect.x > p->position.x)
						r++;
					else if (intersect.x < p->position.x)
						l++;
				}
			} // if we did get an intersection

			// If either side has no intersections, then it's out of bounds (likely)
			if ((l % 2 == 0) && (r % 2 == 0)) epc[side]++;
		} // pins

		if (debug) fprintf(stderr, "EPC[%d]: %d\n", side, epc[side]);

		// flip the outline
		for (auto &p : outline) p->y = max.y - p->y;

	} // side

	if ((epc[0] || epc[1]) && (epc[0] > epc[1])) {
		for (auto &p : outline) p->y = max.y - p->y;
	}

	return 0;
}